

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

lys_module *
moveto_resolve_model
          (char *mod_name_ns,uint16_t mod_nam_ns_len,ly_ctx *ctx,lys_node *cur_snode,int is_name,
          int import_and_disabled_model)

{
  byte bVar1;
  lys_module *plVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  lys_module *plVar6;
  lys_module **pplVar7;
  long lVar8;
  ulong __n;
  ushort uVar9;
  
  if (cur_snode != (lys_node *)0x0) {
    bVar1 = (ctx->models).parsing_sub_modules_count;
    if (bVar1 == 0) {
      pplVar7 = &cur_snode->module;
    }
    else {
      pplVar7 = (ctx->models).parsing_sub_modules + (bVar1 - 1);
    }
    plVar2 = *pplVar7;
    plVar6 = lys_main_module(plVar2);
    pcVar3 = plVar6->name;
    __n = (ulong)mod_nam_ns_len;
    iVar4 = strncmp(pcVar3,mod_name_ns,__n);
    if ((iVar4 == 0) && (pcVar3[__n] == '\0')) {
      return plVar6;
    }
    bVar1 = plVar2->imp_size;
    for (lVar8 = 0; (ulong)bVar1 * 0x38 != lVar8; lVar8 = lVar8 + 0x38) {
      plVar6 = *(lys_module **)(plVar2->imp->rev + lVar8 + -0x10);
      pcVar3 = plVar6->name;
      iVar4 = strncmp(pcVar3,mod_name_ns,__n);
      if ((iVar4 == 0) && (pcVar3[__n] == '\0')) {
        return plVar6;
      }
    }
  }
  iVar4 = (ctx->models).used;
  uVar9 = 0;
  do {
    if (iVar4 <= (int)(uint)uVar9) {
      return (lys_module *)0x0;
    }
    plVar2 = (ctx->models).list[uVar9];
    if ((is_name != 0) || ((*(ushort *)&plVar2->field_0x40 & 0xc0) == 0x80)) {
      pcVar3 = plVar2->name;
      iVar5 = strncmp(pcVar3,mod_name_ns,(ulong)mod_nam_ns_len);
      if ((iVar5 == 0) && (pcVar3[mod_nam_ns_len] == '\0')) {
        return plVar2;
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static struct lys_module *
moveto_resolve_model(const char *mod_name_ns, uint16_t mod_nam_ns_len, struct ly_ctx *ctx, struct lys_node *cur_snode,
                     int is_name, int import_and_disabled_model)
{
    uint16_t i;
    const char *str;
    struct lys_module *mod, *mainmod;

    if (cur_snode) {
        /* detect if the XPath is used in augment - in such a case the module of the context node (cur_snode)
         * differs from the currently processed module. Then, we have to use the currently processed module
         * for searching for the module/namespace instead of the module of the context node */
        if (ctx->models.parsing_sub_modules_count &&
                cur_snode->module != ctx->models.parsing_sub_modules[ctx->models.parsing_sub_modules_count - 1]) {
            mod = ctx->models.parsing_sub_modules[ctx->models.parsing_sub_modules_count - 1];
        } else {
            mod = cur_snode->module;
        }
        mainmod = lys_main_module(mod);

        str = (is_name ? mainmod->name : mainmod->ns);
        if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
            return mainmod;
        }

        for (i = 0; i < mod->imp_size; ++i) {
            str = (is_name ? mod->imp[i].module->name : mod->imp[i].module->ns);
            if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
                return mod->imp[i].module;
            }
        }
    }

    for (i = 0; i < ctx->models.used; ++i) {
        if (!import_and_disabled_model && (!ctx->models.list[i]->implemented || ctx->models.list[i]->disabled)) {
            /* skip not implemented or disabled modules */
            continue;
        }
        str = (is_name ? ctx->models.list[i]->name : ctx->models.list[i]->ns);
        if (!strncmp(str, mod_name_ns, mod_nam_ns_len) && !str[mod_nam_ns_len]) {
            return ctx->models.list[i];
        }
    }

    return NULL;
}